

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O0

ares_bool_t ares_hosts_expired(char *filename,ares_hosts_file_t *hf)

{
  int iVar1;
  ares_bool_t aVar2;
  time_t tVar3;
  undefined1 local_b8 [8];
  stat st;
  time_t mod_ts;
  ares_hosts_file_t *hf_local;
  char *filename_local;
  
  st.__glibc_reserved[2] = 0;
  iVar1 = stat(filename,(stat *)local_b8);
  if (iVar1 == 0) {
    st.__glibc_reserved[2] = st.st_atim.tv_nsec;
  }
  if (hf == (ares_hosts_file_t *)0x0) {
    filename_local._4_4_ = ARES_TRUE;
  }
  else {
    if (st.__glibc_reserved[2] == 0) {
      tVar3 = time((time_t *)0x0);
      st.__glibc_reserved[2] = tVar3 + -0x3c;
    }
    aVar2 = ares_strcaseeq(hf->filename,filename);
    if (aVar2 == ARES_FALSE) {
      filename_local._4_4_ = ARES_TRUE;
    }
    else if (st.__glibc_reserved[2] < hf->ts) {
      filename_local._4_4_ = ARES_FALSE;
    }
    else {
      filename_local._4_4_ = ARES_TRUE;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static ares_bool_t ares_hosts_expired(const char              *filename,
                                      const ares_hosts_file_t *hf)
{
  time_t mod_ts = 0;

#ifdef HAVE_STAT
  struct stat st;
  if (stat(filename, &st) == 0) {
    mod_ts = st.st_mtime;
  }
#elif defined(_WIN32)
  struct _stat st;
  if (_stat(filename, &st) == 0) {
    mod_ts = st.st_mtime;
  }
#else
  (void)filename;
#endif

  if (hf == NULL) {
    return ARES_TRUE;
  }

  /* Expire every 60s if we can't get a time */
  if (mod_ts == 0) {
    mod_ts =
      time(NULL) - 60; /* LCOV_EXCL_LINE: only on systems without stat() */
  }

  /* If filenames are different, its expired */
  if (!ares_strcaseeq(hf->filename, filename)) {
    return ARES_TRUE;
  }

  if (hf->ts <= mod_ts) {
    return ARES_TRUE;
  }

  return ARES_FALSE;
}